

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_vfs_info(ma_vfs *pVFS,ma_vfs_file file,ma_file_info *pInfo)

{
  ma_vfs_callbacks *pCallbacks;
  ma_file_info *pInfo_local;
  ma_vfs_file file_local;
  ma_vfs *pVFS_local;
  
  if (pInfo == (ma_file_info *)0x0) {
    pVFS_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pInfo,0,8);
    if ((pVFS == (ma_vfs *)0x0) || (file == (ma_vfs_file)0x0)) {
      pVFS_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (*(long *)((long)pVFS + 0x38) == 0) {
      pVFS_local._4_4_ = MA_NOT_IMPLEMENTED;
    }
    else {
      pVFS_local._4_4_ = (**(code **)((long)pVFS + 0x38))(pVFS,file,pInfo);
    }
  }
  return pVFS_local._4_4_;
}

Assistant:

MA_API ma_result ma_vfs_info(ma_vfs* pVFS, ma_vfs_file file, ma_file_info* pInfo)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pInfo == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pInfo);

    if (pVFS == NULL || file == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onInfo == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onInfo(pVFS, file, pInfo);
}